

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timing.cpp
# Opt level: O2

void __thiscall Timing::Save(Timing *this,ofstream *of)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  poVar1 = std::ostream::_M_insert<long>((long)of);
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->_m_timesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->_m_timesMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    for (p_Var3 = *(_Base_ptr *)(p_Var2 + 2); p_Var3 != p_Var2[2]._M_parent;
        p_Var3 = (_Base_ptr)&p_Var3->_M_right) {
      if (*(char *)&p_Var3->_M_left == '\x01') {
        poVar1 = std::operator<<((ostream *)of,(string *)(p_Var2 + 1));
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
    }
  }
  return;
}

Assistant:

void Timing::Save(ofstream &of) const
{
    of << _m_timeAtInitialization << endl;

    map<string, vector<Times> >::const_iterator i;
    for(i=_m_timesMap.begin(); i!=_m_timesMap.end(); ++i)
    {
        const vector<Times> &times=i->second;
        const string &id=i->first;

        for(vector<Times>::const_iterator j=times.begin();
            j!=times.end();++j)
        {
            if(j->hasEnded)
                of << id << " " << j->start << " " << j->end << endl;
        }
    }
}